

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O2

Value * Kvm::openOutputPortProc(Kvm *vm,Value *args)

{
  Value *pVVar1;
  KatException *this;
  pointer *__ptr;
  _Head_base<0UL,_std::basic_ofstream<char,_std::char_traits<char>_>_*,_false> local_48;
  _Head_base<0UL,_std::basic_ofstream<char,_std::char_traits<char>_>_*,_false> local_40;
  char *filename;
  string msg;
  
  filename = (char *)args[1]._vptr_Value[3];
  std::make_unique<std::ofstream,char_const*&>((char **)&local_40);
  if (local_40._M_head_impl != (basic_ofstream<char,_std::char_traits<char>_> *)0x0) {
    local_48._M_head_impl = local_40._M_head_impl;
    local_40._M_head_impl = (basic_ofstream<char,_std::char_traits<char>_> *)0x0;
    pVVar1 = makeOutputPort(vm,(unique_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                                *)&local_48);
    if (local_48._M_head_impl != (basic_ofstream<char,_std::char_traits<char>_> *)0x0) {
      (**(code **)(*(long *)local_48._M_head_impl + 8))();
    }
    local_48._M_head_impl = (basic_ofstream<char,_std::char_traits<char>_> *)0x0;
    if (local_40._M_head_impl != (basic_ofstream<char,_std::char_traits<char>_> *)0x0) {
      (**(code **)(*(long *)local_40._M_head_impl + 8))();
    }
    return pVVar1;
  }
  msg._M_dataplus._M_p = (pointer)&msg.field_2;
  msg._M_string_length = 0;
  msg.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::append((char *)&msg);
  std::__cxx11::string::append((char *)&msg);
  std::__cxx11::string::append((char *)&msg);
  this = (KatException *)__cxa_allocate_exception(0x10);
  anon_unknown.dwarf_e6eb::KatException::KatException(this,&msg);
  __cxa_throw(this,&(anonymous_namespace)::KatException::typeinfo,std::runtime_error::~runtime_error
             );
}

Assistant:

const Value* Kvm::openOutputPortProc(Kvm *vm, const Value *args)
{
    const String *s = static_cast<const String *>(car(args));
    auto filename = s->value_;
    std::unique_ptr<std::ofstream> out = std::make_unique<std::ofstream>(filename);
    if (!out)
    {
        std::string msg;
        msg.append("could not open file \"");
        msg.append(filename);
        msg.append("\"");
        throw KatException(msg);
    }
    return vm->makeOutputPort(std::move(out));
}